

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O0

void __thiscall ON_Matrix::Destroy(ON_Matrix *this)

{
  DBLBLK *pDVar1;
  DBLBLK *next_cmem;
  DBLBLK *cmem;
  ON_Matrix *this_local;
  
  this->m = (double **)0x0;
  this->m_row_count = 0;
  this->m_col_count = 0;
  ON_SimpleArray<double_*>::SetCount(&this->m_rowmem,0);
  if (this->m_Mmem != (double **)0x0) {
    onfree(this->m_Mmem);
    this->m_Mmem = (double **)0x0;
  }
  this->m_row_offset = 0;
  this->m_col_offset = 0;
  next_cmem = (DBLBLK *)this->m_cmem;
  this->m_cmem = (void *)0x0;
  while (next_cmem != (DBLBLK *)0x0) {
    pDVar1 = next_cmem->next;
    onfree(next_cmem);
    next_cmem = pDVar1;
  }
  return;
}

Assistant:

void ON_Matrix::Destroy()
{
  m = 0;
  m_row_count = 0;
  m_col_count = 0;
  m_rowmem.SetCount(0);
  if ( 0 != m_Mmem )
  {
    // pointer passed to Create( row_count, col_count, M, bDestructorFreeM )
    // when bDestructorFreeM = true.
    onfree(m_Mmem);
    m_Mmem = 0;
  }
	m_row_offset = 0;
	m_col_offset = 0;
  struct DBLBLK* cmem = (struct DBLBLK*)m_cmem;
  m_cmem = 0;
  while( 0 != cmem )
  {
    struct DBLBLK* next_cmem = cmem->next;
    onfree(cmem);
    cmem = next_cmem;
  }
}